

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicon.cpp
# Opt level: O3

void __thiscall
QPixmapIconEngine::addFile
          (QPixmapIconEngine *this,QString *fileName,QSize *size,Mode mode,State state)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  QSize QVar6;
  QSize QVar7;
  pointer pQVar8;
  ulong uVar9;
  ssize_t sVar10;
  undefined4 in_register_0000000c;
  QSize *__nbytes;
  void *__buf;
  void *__buf_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf_01;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *__buf_02;
  QImage *i;
  QImage *this_00;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  long in_FS_OFFSET;
  QStringView QVar14;
  QStringView QVar15;
  undefined1 auVar16 [16];
  QArrayDataPointer<QImage> local_118;
  undefined1 local_f8 [16];
  QExplicitlySharedDataPointer<QPlatformPixmap> local_e8;
  QArrayData *local_e0;
  char16_t *local_d8;
  QSize *pQStack_d0;
  QSize local_c8;
  Mode local_c0;
  State local_bc;
  undefined1 local_b8 [16];
  QImageData *local_a8;
  QByteArray local_98;
  QString local_78;
  QString local_60;
  undefined1 local_48 [16];
  long local_38;
  
  __nbytes = (QSize *)CONCAT44(in_register_0000000c,mode);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((fileName->d).size != 0) {
    local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    cVar2 = QString::startsWith((QChar)(char16_t)fileName,0x3a);
    if (cVar2 == '\0') {
      QFileInfo::QFileInfo((QFileInfo *)local_f8,(QString *)fileName);
      QFileInfo::absoluteFilePath();
      QFileInfo::~QFileInfo((QFileInfo *)local_f8);
    }
    else {
      local_78.d.d = (fileName->d).d;
      local_78.d.ptr = (fileName->d).ptr;
      __nbytes = (QSize *)(fileName->d).size;
      local_78.d.size = (qsizetype)__nbytes;
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    bVar1 = (byte)((uint)(size->ht).m_i >> 0x18) | (byte)((uint)(size->wd).m_i >> 0x18);
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    anon_unknown.dwarf_cb874::ImageReader::ImageReader((ImageReader *)local_48,&local_78);
    local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QImageReader::format(&local_98,(QImageReader *)local_48);
    if ((undefined1 *)local_98.d.size != (undefined1 *)0x0) {
      local_a8 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
      local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QImage::QImage((QImage *)local_b8);
      local_f8._0_8_ = "ico";
      bVar3 = operator!=(&local_98,(char **)local_f8);
      if (bVar3) {
        if ((char)bVar1 < '\0') {
          bVar3 = QImageReader::supportsOption((QImageReader *)local_48,Size);
          if (bVar3) {
            do {
              QVar6 = QImageReader::size((QImageReader *)local_48);
              QPixmap::QPixmap((QPixmap *)local_f8);
              local_e0 = &(local_78.d.d)->super_QArrayData;
              local_d8 = local_78.d.ptr;
              pQStack_d0 = (QSize *)local_78.d.size;
              if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + 1;
                UNLOCK();
              }
              local_c8 = QVar6;
              local_c0 = mode;
              local_bc = state;
              QtPrivate::QMovableArrayOps<QPixmapIconEngineEntry>::emplace<QPixmapIconEngineEntry>
                        ((QMovableArrayOps<QPixmapIconEngineEntry> *)&this->pixmaps,
                         (this->pixmaps).d.size,(QPixmapIconEngineEntry *)local_f8);
              QList<QPixmapIconEngineEntry>::end(&this->pixmaps);
              if (local_e0 != (QArrayData *)0x0) {
                LOCK();
                (local_e0->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_e0,2,0x10);
                }
              }
              QPixmap::~QPixmap((QPixmap *)local_f8);
              bVar3 = QImageReader::jumpToNextImage((QImageReader *)local_48);
            } while (bVar3);
          }
          else {
            sVar10 = anon_unknown.dwarf_cb874::ImageReader::read
                               ((ImageReader *)local_48,(int)local_b8,__buf_00,(size_t)__nbytes);
            if ((char)sVar10 != '\0') {
              do {
                QPixmap::QPixmap((QPixmap *)local_f8);
                local_e0 = &(local_78.d.d)->super_QArrayData;
                local_d8 = local_78.d.ptr;
                pQStack_d0 = (QSize *)local_78.d.size;
                if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + 1;
                  UNLOCK();
                }
                local_c8 = QImage::size((QImage *)local_b8);
                local_c0 = mode;
                local_bc = state;
                QPixmap::convertFromImage
                          ((QPixmap *)local_f8,(QImage *)local_b8,(ImageConversionFlags)0x0);
                QtPrivate::QMovableArrayOps<QPixmapIconEngineEntry>::emplace<QPixmapIconEngineEntry>
                          ((QMovableArrayOps<QPixmapIconEngineEntry> *)&this->pixmaps,
                           (this->pixmaps).d.size,(QPixmapIconEngineEntry *)local_f8);
                QList<QPixmapIconEngineEntry>::end(&this->pixmaps);
                if (local_e0 != (QArrayData *)0x0) {
                  LOCK();
                  (local_e0->ref_)._q_value.super___atomic_base<int>._M_i =
                       (local_e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((local_e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(local_e0,2,0x10);
                  }
                }
                QPixmap::~QPixmap((QPixmap *)local_f8);
                sVar10 = anon_unknown.dwarf_cb874::ImageReader::read
                                   ((ImageReader *)local_48,(int)(QImage *)local_b8,__buf_02,
                                    (size_t)__nbytes);
              } while ((char)sVar10 != '\0');
            }
          }
        }
        else {
          QPixmap::QPixmap((QPixmap *)local_f8);
          local_e0 = &(local_78.d.d)->super_QArrayData;
          local_d8 = local_78.d.ptr;
          pQStack_d0 = (QSize *)local_78.d.size;
          if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_c8 = *size;
          local_c0 = mode;
          local_bc = state;
          QtPrivate::QMovableArrayOps<QPixmapIconEngineEntry>::emplace<QPixmapIconEngineEntry>
                    ((QMovableArrayOps<QPixmapIconEngineEntry> *)&this->pixmaps,
                     (this->pixmaps).d.size,(QPixmapIconEngineEntry *)local_f8);
          QList<QPixmapIconEngineEntry>::end(&this->pixmaps);
          if (local_e0 != (QArrayData *)0x0) {
            LOCK();
            (local_e0->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_e0,2,0x10);
            }
          }
          QPixmap::~QPixmap((QPixmap *)local_f8);
        }
      }
      else {
        local_118.d = (Data *)0x0;
        local_118.ptr = (QImage *)0x0;
        local_118.size = 0;
        sVar10 = anon_unknown.dwarf_cb874::ImageReader::read
                           ((ImageReader *)local_48,(int)local_b8,__buf,(size_t)__nbytes);
        if ((char)sVar10 != '\0') {
          do {
            if (((char)bVar1 < '\0') ||
               ((QVar6 = QImage::size((QImage *)local_b8), __nbytes = size, __buf_01 = extraout_RDX,
                (size->wd).m_i == QVar6.wd.m_i.m_i && ((size->ht).m_i == QVar6.ht.m_i.m_i)))) {
              QVar6 = QImage::size((QImage *)local_b8);
              if (local_118.size == 0) {
                uVar9 = 0;
              }
              else {
                lVar13 = 0;
                uVar12 = 0;
                do {
                  QVar7 = QImage::size((QImage *)
                                       ((long)&((local_118.ptr)->super_QPaintDevice).
                                               _vptr_QPaintDevice + lVar13));
                  uVar9 = local_118.size;
                  if (QVar6 == QVar7) {
                    if (-1 < (int)(uint)uVar12) {
                      local_e8.d.ptr =
                           (totally_ordered_wrapper<QPlatformPixmap_*>)&DAT_aaaaaaaaaaaaaaaa;
                      local_f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                      local_f8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                      local_60.d.d = (Data *)0x0;
                      local_60.d.ptr = L"_q_icoOrigDepth";
                      local_60.d.size = 0xf;
                      QImage::text((QString *)local_f8,(QImage *)local_b8,&local_60);
                      if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
                        LOCK();
                        ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i = ((local_60.d.d)->super_QArrayData).ref_._q_value.
                               super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if (((local_60.d.d)->super_QArrayData).ref_._q_value.
                            super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
                        }
                      }
                      if (local_e8.d.ptr == (QPlatformPixmap *)0x0) {
                        iVar4 = 0x20;
                      }
                      else {
                        __nbytes = (QSize *)0xa;
                        QVar14.m_data = (storage_type_conflict *)local_f8._8_8_;
                        QVar14.m_size = (qsizetype)local_e8.d.ptr;
                        lVar13 = QString::toIntegral_helper(QVar14,(bool *)0x0,10);
                        iVar4 = (int)lVar13;
                        if (iVar4 != lVar13) {
                          iVar4 = 0;
                        }
                      }
                      if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
                        LOCK();
                        (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i = (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).
                               super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>
                            ._M_i == 0) {
                          QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
                        }
                      }
                      uVar11 = (uint)uVar12 & 0x7fffffff;
                      local_e8.d.ptr =
                           (totally_ordered_wrapper<QPlatformPixmap_*>)&DAT_aaaaaaaaaaaaaaaa;
                      local_f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                      local_f8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                      local_60.d.d = (Data *)0x0;
                      local_60.d.ptr = L"_q_icoOrigDepth";
                      local_60.d.size = 0xf;
                      QImage::text((QString *)local_f8,local_118.ptr + uVar11,&local_60);
                      __buf_01 = extraout_RDX_01;
                      if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
                        LOCK();
                        ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i = ((local_60.d.d)->super_QArrayData).ref_._q_value.
                               super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if (((local_60.d.d)->super_QArrayData).ref_._q_value.
                            super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
                          __buf_01 = extraout_RDX_02;
                        }
                      }
                      if (local_e8.d.ptr == (QPlatformPixmap *)0x0) {
                        iVar5 = 0x20;
                      }
                      else {
                        __nbytes = (QSize *)0xa;
                        QVar15.m_data = (storage_type_conflict *)local_f8._8_8_;
                        QVar15.m_size = (qsizetype)local_e8.d.ptr;
                        auVar16 = QString::toIntegral_helper(QVar15,(bool *)0x0,10);
                        __buf_01 = auVar16._8_8_;
                        iVar5 = auVar16._0_4_;
                        if ((long)iVar5 != auVar16._0_8_) {
                          iVar5 = 0;
                        }
                      }
                      if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
                        LOCK();
                        (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i = (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).
                               super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>
                            ._M_i == 0) {
                          QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
                          __buf_01 = extraout_RDX_03;
                        }
                      }
                      if (iVar5 < iVar4) {
                        pQVar8 = QList<QImage>::data((QList<QImage> *)&local_118);
                        QImage::operator=(pQVar8 + uVar11,(QImage *)local_b8);
                        __buf_01 = extraout_RDX_04;
                      }
                      goto LAB_002700ef;
                    }
                    break;
                  }
                  uVar12 = uVar12 + 1;
                  lVar13 = lVar13 + 0x18;
                } while (uVar12 < (ulong)local_118.size);
              }
              QtPrivate::QMovableArrayOps<QImage>::emplace<QImage_const&>
                        ((QMovableArrayOps<QImage> *)&local_118,uVar9,(QImage *)local_b8);
              QList<QImage>::end((QList<QImage> *)&local_118);
              __buf_01 = extraout_RDX_00;
            }
LAB_002700ef:
            sVar10 = anon_unknown.dwarf_cb874::ImageReader::read
                               ((ImageReader *)local_48,(int)(QImage *)local_b8,__buf_01,
                                (size_t)__nbytes);
          } while ((char)sVar10 != '\0');
        }
        if (local_118.size == 0) {
          uVar9 = 0;
        }
        else {
          lVar13 = local_118.size * 0x18;
          this_00 = local_118.ptr;
          do {
            QPixmap::QPixmap((QPixmap *)local_f8);
            local_e0 = &(local_78.d.d)->super_QArrayData;
            local_d8 = local_78.d.ptr;
            pQStack_d0 = (QSize *)local_78.d.size;
            if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   1;
              UNLOCK();
            }
            local_c8 = QImage::size(this_00);
            local_c0 = mode;
            local_bc = state;
            QPixmap::convertFromImage((QPixmap *)local_f8,this_00,(ImageConversionFlags)0x0);
            QtPrivate::QMovableArrayOps<QPixmapIconEngineEntry>::emplace<QPixmapIconEngineEntry>
                      ((QMovableArrayOps<QPixmapIconEngineEntry> *)&this->pixmaps,
                       (this->pixmaps).d.size,(QPixmapIconEngineEntry *)local_f8);
            QList<QPixmapIconEngineEntry>::end(&this->pixmaps);
            if (local_e0 != (QArrayData *)0x0) {
              LOCK();
              (local_e0->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_e0,2,0x10);
              }
            }
            QPixmap::~QPixmap((QPixmap *)local_f8);
            this_00 = this_00 + 1;
            lVar13 = lVar13 + -0x18;
            uVar9 = local_118.size;
          } while (lVar13 != 0);
        }
        if (-1 < (char)bVar1 && uVar9 == 0) {
          QPixmap::QPixmap((QPixmap *)local_f8);
          local_e0 = &(local_78.d.d)->super_QArrayData;
          local_d8 = local_78.d.ptr;
          pQStack_d0 = (QSize *)local_78.d.size;
          if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_c8 = *size;
          local_c0 = mode;
          local_bc = state;
          QtPrivate::QMovableArrayOps<QPixmapIconEngineEntry>::emplace<QPixmapIconEngineEntry>
                    ((QMovableArrayOps<QPixmapIconEngineEntry> *)&this->pixmaps,
                     (this->pixmaps).d.size,(QPixmapIconEngineEntry *)local_f8);
          QList<QPixmapIconEngineEntry>::end(&this->pixmaps);
          if (local_e0 != (QArrayData *)0x0) {
            LOCK();
            (local_e0->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_e0,2,0x10);
            }
          }
          QPixmap::~QPixmap((QPixmap *)local_f8);
        }
        QArrayDataPointer<QImage>::~QArrayDataPointer(&local_118);
      }
      QImage::~QImage((QImage *)local_b8);
    }
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
      }
    }
    QImageReader::~QImageReader((QImageReader *)local_48);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPixmapIconEngine::addFile(const QString &fileName, const QSize &size, QIcon::Mode mode, QIcon::State state)
{
    if (fileName.isEmpty())
        return;
    const QString abs = fileName.startsWith(u':') ? fileName : QFileInfo(fileName).absoluteFilePath();
    const bool ignoreSize = !size.isValid();
    ImageReader imageReader(abs);
    const QByteArray format = imageReader.format();
    if (format.isEmpty()) // Device failed to open or unsupported format.
        return;
    QImage image;
    if (format != "ico") {
        if (ignoreSize) { // No size specified: Add all images.
            if (imageReader.supportsReadSize()) {
                do {
                    pixmaps += QPixmapIconEngineEntry(abs, imageReader.size(), mode, state);
                } while (imageReader.jumpToNextImage());
            } else {
                while (imageReader.read(&image))
                    pixmaps += QPixmapIconEngineEntry(abs, image, mode, state);
            }
        } else {
            pixmaps += QPixmapIconEngineEntry(abs, size, mode, state);
        }
        return;
    }
    // Special case for reading Windows ".ico" files. Historically (QTBUG-39287),
    // these files may contain low-resolution images. As this information is lost,
    // ICOReader sets the original format as an image text key value. Read all matching
    // images into a list trying to find the highest quality per size.
    QList<QImage> icoImages;
    while (imageReader.read(&image)) {
        if (ignoreSize || image.size() == size) {
            const int position = findBySize(icoImages, image.size());
            if (position >= 0) { // Higher quality available? -> replace.
                if (origIcoDepth(image) > origIcoDepth(icoImages.at(position)))
                    icoImages[position] = image;
            } else {
                icoImages.append(image);
            }
        }
    }
    for (const QImage &i : std::as_const(icoImages))
        pixmaps += QPixmapIconEngineEntry(abs, i, mode, state);
    if (icoImages.isEmpty() && !ignoreSize) // Add placeholder with the filename and empty pixmap for the size.
        pixmaps += QPixmapIconEngineEntry(abs, size, mode, state);
}